

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

idx_t duckdb::CalculateSliceLength<long>(idx_t begin,idx_t end,long step,bool svalid)

{
  idx_t iVar1;
  InvalidInputException *this;
  ulong uVar2;
  allocator local_39;
  string local_38;
  
  uVar2 = -step;
  if (0 < step) {
    uVar2 = step;
  }
  if (step != 0 || !svalid) {
    iVar1 = end - begin;
    if (uVar2 != 1) {
      if (uVar2 < iVar1) {
        iVar1 = (iVar1 / uVar2 + 1) - (ulong)(iVar1 % uVar2 == 0);
      }
      else {
        iVar1 = 1;
      }
    }
    return iVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Slice step cannot be zero",&local_39);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static idx_t CalculateSliceLength(idx_t begin, idx_t end, INDEX_TYPE step, bool svalid) {
	if (step < 0) {
		step = AbsValue(step);
	}
	if (step == 0 && svalid) {
		throw InvalidInputException("Slice step cannot be zero");
	}
	if (step == 1) {
		return NumericCast<idx_t>(end - begin);
	} else if (static_cast<idx_t>(step) >= (end - begin)) {
		return 1;
	}
	if ((end - begin) % UnsafeNumericCast<idx_t>(step) != 0) {
		return (end - begin) / UnsafeNumericCast<idx_t>(step) + 1;
	}
	return (end - begin) / UnsafeNumericCast<idx_t>(step);
}